

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

int32 acmod_flags2list(acmod_t *acmod)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  
  iVar9 = acmod->mdef->n_sen;
  if (acmod->compallsen == '\0') {
    iVar4 = iVar9 + 0x1f;
    if (-1 < iVar9) {
      iVar4 = iVar9;
    }
    uVar8 = iVar9 % 0x20;
    puVar6 = acmod->senone_active_vec;
    if (iVar9 < 0x20) {
      uVar2 = 0;
      iVar1 = 0;
      iVar4 = 0;
    }
    else {
      uVar10 = 0;
      iVar9 = 0xff;
      iVar1 = 0;
      uVar2 = 0;
      do {
        if (*puVar6 != 0) {
          lVar3 = 0;
          iVar5 = iVar9;
          do {
            if ((*puVar6 & (uint)(1L << ((byte)lVar3 & 0x3f))) != 0) {
              iVar7 = (int)lVar3 + (int)(uVar10 << 5);
              iVar11 = iVar7 - iVar1;
              if (0xff < iVar11) {
                uVar2 = (ulong)(int)uVar2;
                uVar12 = iVar5 - iVar1;
                do {
                  acmod->senone_active[uVar2] = 0xff;
                  uVar2 = uVar2 + 1;
                  iVar11 = iVar11 + -0xff;
                  uVar12 = uVar12 - 0xff;
                } while (0x1fe < uVar12);
              }
              iVar1 = (int)uVar2;
              uVar2 = (ulong)(iVar1 + 1);
              acmod->senone_active[iVar1] = (uint8)iVar11;
              iVar1 = iVar7;
            }
            lVar3 = lVar3 + 1;
            iVar5 = iVar5 + 1;
          } while (lVar3 != 0x20);
        }
        uVar10 = uVar10 + 1;
        puVar6 = puVar6 + 1;
        iVar9 = iVar9 + 0x20;
      } while (uVar10 != (uint)(iVar4 >> 5));
      iVar4 = (iVar4 >> 5) << 5;
    }
    iVar9 = (int)uVar2;
    if (0 < (int)uVar8) {
      iVar5 = iVar4 + 0xff;
      uVar10 = 0;
      do {
        if ((*puVar6 & (uint)(1L << ((byte)uVar10 & 0x3f))) != 0) {
          iVar9 = (int)uVar10 + iVar4;
          iVar7 = iVar9 - iVar1;
          if (0xff < iVar7) {
            uVar2 = (ulong)(int)uVar2;
            uVar12 = iVar5 - iVar1;
            do {
              acmod->senone_active[uVar2] = 0xff;
              uVar2 = uVar2 + 1;
              iVar7 = iVar7 + -0xff;
              uVar12 = uVar12 - 0xff;
            } while (0x1fe < uVar12);
          }
          iVar1 = (int)uVar2;
          uVar2 = (ulong)(iVar1 + 1);
          acmod->senone_active[iVar1] = (uint8)iVar7;
          iVar1 = iVar9;
        }
        iVar9 = (int)uVar2;
        uVar10 = uVar10 + 1;
        iVar5 = iVar5 + 1;
      } while (uVar10 != uVar8);
    }
  }
  acmod->n_senone_active = iVar9;
  return iVar9;
}

Assistant:

int32
acmod_flags2list(acmod_t *acmod)
{
    int32 w, l, n, b, total_dists, total_words, extra_bits;
    bitvec_t *flagptr;

    total_dists = bin_mdef_n_sen(acmod->mdef);
    if (acmod->compallsen) {
        acmod->n_senone_active = total_dists;
        return total_dists;
    }
    total_words = total_dists / BITVEC_BITS;
    extra_bits = total_dists % BITVEC_BITS;
    w = n = l = 0;
    for (flagptr = acmod->senone_active_vec; w < total_words; ++w, ++flagptr) {
        if (*flagptr == 0)
            continue;
        for (b = 0; b < BITVEC_BITS; ++b) {
            if (*flagptr & (1UL << b)) {
                int32 sen = w * BITVEC_BITS + b;
                int32 delta = sen - l;
                /* Handle excessive deltas "lossily" by adding a few
                   extra senones to bridge the gap. */
                while (delta > 255) {
                    acmod->senone_active[n++] = 255;
                    delta -= 255;
                }
                acmod->senone_active[n++] = delta;
                l = sen;
            }
        }
    }

    for (b = 0; b < extra_bits; ++b) {
        if (*flagptr & (1UL << b)) {
            int32 sen = w * BITVEC_BITS + b;
            int32 delta = sen - l;
            /* Handle excessive deltas "lossily" by adding a few
               extra senones to bridge the gap. */
            while (delta > 255) {
                acmod->senone_active[n++] = 255;
                delta -= 255;
            }
            acmod->senone_active[n++] = delta;
            l = sen;
        }
    }

    acmod->n_senone_active = n;
    E_DEBUG("acmod_flags2list: %d active in frame %d\n",
            acmod->n_senone_active, acmod->output_frame);
    return n;
}